

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typebase.h
# Opt level: O3

bool __thiscall ICM::TypeBase::DisperseType::operator==(DisperseType *this,DisperseType *lt)

{
  pointer __s1;
  pointer ppOVar1;
  pointer __s2;
  int iVar2;
  size_t __n;
  
  __s1 = (this->data).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  ppOVar1 = (this->data).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  __n = (long)ppOVar1 - (long)__s1;
  __s2 = (lt->data).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (__n != (long)(lt->data).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)__s2) {
    return false;
  }
  if (ppOVar1 != __s1) {
    iVar2 = bcmp(__s1,__s2,__n);
    return iVar2 == 0;
  }
  return true;
}

Assistant:

bool operator==(const DisperseType &lt) const {
				return this->data == lt.data;
			}